

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O2

uint8_t record_type(MMDB_s *mmdb,uint64_t record)

{
  uint8_t uVar1;
  ulong uVar2;
  
  if (record == 0) {
    return '\x03';
  }
  uVar2 = (ulong)(mmdb->metadata).node_count;
  if (record < uVar2) {
    uVar1 = '\0';
  }
  else {
    uVar1 = '\x01';
    if (record != uVar2) {
      return record - uVar2 < (ulong)mmdb->data_section_size ^ 3;
    }
  }
  return uVar1;
}

Assistant:

static uint8_t record_type(const MMDB_s *const mmdb, uint64_t record) {
    uint32_t node_count = mmdb->metadata.node_count;

    /* Ideally we'd check to make sure that a record never points to a
     * previously seen value, but that's more complicated. For now, we can
     * at least check that we don't end up at the top of the tree again. */
    if (record == 0) {
        DEBUG_MSG("record has a value of 0");
        return MMDB_RECORD_TYPE_INVALID;
    }

    if (record < node_count) {
        return MMDB_RECORD_TYPE_SEARCH_NODE;
    }

    if (record == node_count) {
        return MMDB_RECORD_TYPE_EMPTY;
    }

    if (record - node_count < mmdb->data_section_size) {
        return MMDB_RECORD_TYPE_DATA;
    }

    DEBUG_MSG("record has a value that points outside of the database");
    return MMDB_RECORD_TYPE_INVALID;
}